

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

void __thiscall
CMethod::CMethod(CMethod *this,CType *_returnType,IExpression *_returnExp,CIdExp *_name,
                CArgumentList *_arguments,CFieldList *_vars,CCompoundStm *_statements,bool _isPublic
                )

{
  int iVar1;
  unique_ptr<CFieldList,_std::default_delete<CFieldList>_> local_70;
  unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_> local_68;
  unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_> local_60;
  unique_ptr<CIdExp,_std::default_delete<CIdExp>_> local_58;
  unique_ptr<IExpression,_std::default_delete<IExpression>_> local_50;
  unique_ptr<CType,_std::default_delete<CType>_> local_48;
  byte local_39;
  CFieldList *pCStack_38;
  bool _isPublic_local;
  CFieldList *_vars_local;
  CArgumentList *_arguments_local;
  CIdExp *_name_local;
  IExpression *_returnExp_local;
  CType *_returnType_local;
  CMethod *this_local;
  
  local_39 = _isPublic;
  pCStack_38 = _vars;
  _vars_local = (CFieldList *)_arguments;
  _arguments_local = (CArgumentList *)_name;
  _name_local = (CIdExp *)_returnExp;
  _returnExp_local = (IExpression *)_returnType;
  _returnType_local = (CType *)this;
  IWrapper::IWrapper(&this->super_IWrapper);
  (this->super_IWrapper).super_PositionedNode.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00236b08;
  std::unique_ptr<CType,std::default_delete<CType>>::unique_ptr<std::default_delete<CType>,void>
            ((unique_ptr<CType,std::default_delete<CType>> *)&this->returnType);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&this->returnExp);
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&this->name);
  std::unique_ptr<CArgumentList,std::default_delete<CArgumentList>>::
  unique_ptr<std::default_delete<CArgumentList>,void>
            ((unique_ptr<CArgumentList,std::default_delete<CArgumentList>> *)&this->arguments);
  std::unique_ptr<CCompoundStm,std::default_delete<CCompoundStm>>::
  unique_ptr<std::default_delete<CCompoundStm>,void>
            ((unique_ptr<CCompoundStm,std::default_delete<CCompoundStm>> *)&this->statements);
  std::unique_ptr<CFieldList,std::default_delete<CFieldList>>::
  unique_ptr<std::default_delete<CFieldList>,void>
            ((unique_ptr<CFieldList,std::default_delete<CFieldList>> *)&this->vars);
  std::unique_ptr<CType,std::default_delete<CType>>::unique_ptr<std::default_delete<CType>,void>
            ((unique_ptr<CType,std::default_delete<CType>> *)&local_48,(pointer)_returnExp_local);
  std::unique_ptr<CType,_std::default_delete<CType>_>::operator=(&this->returnType,&local_48);
  std::unique_ptr<CType,_std::default_delete<CType>_>::~unique_ptr(&local_48);
  std::unique_ptr<IExpression,std::default_delete<IExpression>>::
  unique_ptr<std::default_delete<IExpression>,void>
            ((unique_ptr<IExpression,std::default_delete<IExpression>> *)&local_50,
             &_name_local->super_IExpression);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator=
            (&this->returnExp,&local_50);
  std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::~unique_ptr(&local_50);
  std::unique_ptr<CIdExp,std::default_delete<CIdExp>>::unique_ptr<std::default_delete<CIdExp>,void>
            ((unique_ptr<CIdExp,std::default_delete<CIdExp>> *)&local_58,(pointer)_arguments_local);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator=(&this->name,&local_58);
  std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::~unique_ptr(&local_58);
  std::unique_ptr<CArgumentList,std::default_delete<CArgumentList>>::
  unique_ptr<std::default_delete<CArgumentList>,void>
            ((unique_ptr<CArgumentList,std::default_delete<CArgumentList>> *)&local_60,
             (pointer)_vars_local);
  std::unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_>::operator=
            (&this->arguments,&local_60);
  std::unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_>::~unique_ptr(&local_60);
  std::unique_ptr<CCompoundStm,std::default_delete<CCompoundStm>>::
  unique_ptr<std::default_delete<CCompoundStm>,void>
            ((unique_ptr<CCompoundStm,std::default_delete<CCompoundStm>> *)&local_68,_statements);
  std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator=
            (&this->statements,&local_68);
  std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::~unique_ptr(&local_68);
  std::unique_ptr<CFieldList,std::default_delete<CFieldList>>::
  unique_ptr<std::default_delete<CFieldList>,void>
            ((unique_ptr<CFieldList,std::default_delete<CFieldList>> *)&local_70,pCStack_38);
  std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator=(&this->vars,&local_70);
  std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::~unique_ptr(&local_70);
  this->isPublic = (bool)(local_39 & 1);
  iVar1 = (_arguments_local->super_IWrapper).super_PositionedNode.position.lastLine;
  (this->super_IWrapper).super_PositionedNode.position.firstLine =
       (_arguments_local->super_IWrapper).super_PositionedNode.position.firstLine;
  (this->super_IWrapper).super_PositionedNode.position.lastLine = iVar1;
  iVar1 = (_arguments_local->super_IWrapper).super_PositionedNode.position.lastColumn;
  (this->super_IWrapper).super_PositionedNode.position.firstColumn =
       (_arguments_local->super_IWrapper).super_PositionedNode.position.firstColumn;
  (this->super_IWrapper).super_PositionedNode.position.lastColumn = iVar1;
  return;
}

Assistant:

CMethod::CMethod(CType* _returnType, IExpression* _returnExp, CIdExp* _name, CArgumentList* _arguments, CFieldList* _vars, CCompoundStm* _statements, bool _isPublic)
{
	returnType = std::unique_ptr<CType>(_returnType);
	returnExp = std::unique_ptr<IExpression>(_returnExp);
	name = std::unique_ptr<CIdExp>(_name);
	arguments = std::unique_ptr<CArgumentList>(_arguments);
	statements = std::unique_ptr<CCompoundStm>(_statements);
	vars = std::unique_ptr<CFieldList>(_vars);
	isPublic = _isPublic;
    position = _name->position;
}